

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flowImpl.h
# Opt level: O2

void __thiscall FlowImpl::~FlowImpl(FlowImpl *this)

{
  (this->super_Flow)._vptr_Flow = (_func_int **)&PTR___cxa_pure_virtual_00107c48;
  std::__cxx11::string::~string((string *)&this->name);
  return;
}

Assistant:

~FlowImpl() override = default;